

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

void UnloadDehSupp(void)

{
  FState *state;
  FStringTable *pFVar1;
  uint uVar2;
  MBFParamState *pMVar3;
  uint local_c;
  uint i;
  
  DehUseCount = DehUseCount + -1;
  if (DehUseCount < 1) {
    for (local_c = 0; uVar2 = TArray<MBFParamState,_MBFParamState>::Size(&MBFParamStates),
        local_c < uVar2; local_c = local_c + 1) {
      pMVar3 = TArray<MBFParamState,_MBFParamState>::operator[](&MBFParamStates,(ulong)local_c);
      state = pMVar3->state;
      pMVar3 = TArray<MBFParamState,_MBFParamState>::operator[](&MBFParamStates,(ulong)local_c);
      SetDehParams(state,pMVar3->pointer);
    }
    TArray<MBFParamState,_MBFParamState>::Clear(&MBFParamStates);
    TArray<MBFParamState,_MBFParamState>::ShrinkToFit(&MBFParamStates);
    TArray<CodePointerAlias,_CodePointerAlias>::Clear(&MBFCodePointers);
    TArray<CodePointerAlias,_CodePointerAlias>::ShrinkToFit(&MBFCodePointers);
    DehUseCount = 0;
    TArray<PFunction_*,_PFunction_*>::Clear(&Actions);
    TArray<PFunction_*,_PFunction_*>::ShrinkToFit(&Actions);
    TArray<int,_int>::Clear(&OrgHeights);
    TArray<int,_int>::ShrinkToFit(&OrgHeights);
    TArray<int,_int>::Clear(&CodePConv);
    TArray<int,_int>::ShrinkToFit(&CodePConv);
    TArray<DEHSprName,_DEHSprName>::Clear(&OrgSprNames);
    TArray<DEHSprName,_DEHSprName>::ShrinkToFit(&OrgSprNames);
    TArray<FSoundID,_FSoundID>::Clear(&SoundMap);
    TArray<FSoundID,_FSoundID>::ShrinkToFit(&SoundMap);
    TArray<PClassActor_*,_PClassActor_*>::Clear(&InfoNames);
    TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&InfoNames);
    TArray<BitName,_BitName>::Clear(&BitNames);
    TArray<BitName,_BitName>::ShrinkToFit(&BitNames);
    TArray<StyleName,_StyleName>::Clear(&StyleNames);
    TArray<StyleName,_StyleName>::ShrinkToFit(&StyleNames);
    TArray<PClassAmmo_*,_PClassAmmo_*>::Clear(&AmmoNames);
    TArray<PClassAmmo_*,_PClassAmmo_*>::ShrinkToFit(&AmmoNames);
    if (UnchangedSpriteNames != (char *)0x0) {
      if (UnchangedSpriteNames != (char *)0x0) {
        operator_delete__(UnchangedSpriteNames);
      }
      UnchangedSpriteNames = (char *)0x0;
      NumUnchangedSprites = 0;
    }
    pFVar1 = EnglishStrings;
    if (EnglishStrings != (FStringTable *)0x0) {
      if (EnglishStrings != (FStringTable *)0x0) {
        FStringTable::~FStringTable(EnglishStrings);
        operator_delete(pFVar1,0x400);
      }
      EnglishStrings = (FStringTable *)0x0;
    }
  }
  return;
}

Assistant:

static void UnloadDehSupp ()
{
	if (--DehUseCount <= 0)
	{
		// Handle MBF params here, before the required arrays are cleared
		for (unsigned int i=0; i < MBFParamStates.Size(); i++)
		{
			SetDehParams(MBFParamStates[i].state, MBFParamStates[i].pointer);
		}
		MBFParamStates.Clear();
		MBFParamStates.ShrinkToFit();
		MBFCodePointers.Clear();
		MBFCodePointers.ShrinkToFit();
		// StateMap is not freed here, because if you load a second
		// dehacked patch through some means other than including it
		// in the first patch, it won't see the state information
		// that was altered by the first. So we need to keep the
		// StateMap around until all patches have been applied.
		DehUseCount = 0;
		Actions.Clear();
		Actions.ShrinkToFit();
		OrgHeights.Clear();
		OrgHeights.ShrinkToFit();
		CodePConv.Clear();
		CodePConv.ShrinkToFit();
		OrgSprNames.Clear();
		OrgSprNames.ShrinkToFit();
		SoundMap.Clear();
		SoundMap.ShrinkToFit();
		InfoNames.Clear();
		InfoNames.ShrinkToFit();
		BitNames.Clear();
		BitNames.ShrinkToFit();
		StyleNames.Clear();
		StyleNames.ShrinkToFit();
		AmmoNames.Clear();
		AmmoNames.ShrinkToFit();

		if (UnchangedSpriteNames != NULL)
		{
			delete[] UnchangedSpriteNames;
			UnchangedSpriteNames = NULL;
			NumUnchangedSprites = 0;
		}
		if (EnglishStrings != NULL)
		{
			delete EnglishStrings;
			EnglishStrings = NULL;
		}
	}
}